

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<std::pair<int,_long>,_60>::Resize
          (TPZManVector<std::pair<int,_long>,_60> *this,int64_t newsize,pair<int,_long> *object)

{
  pair<int,_long> *ppVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  ulong uVar3;
  ulong uVar4;
  pair<int,_long> *ppVar5;
  type in_RDX;
  long in_RSI;
  TPZManVector<std::pair<int,_long>,_60> *in_RDI;
  pair<int,_long> *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  pair<int,_long> *local_80;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements) {
    if ((in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc < in_RSI) {
      if (in_RSI < 0x3d) {
        for (local_28 = 0; local_28 < (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements;
            local_28 = local_28 + 1) {
          std::pair<int,_long>::operator=
                    (in_RDI->fExtAlloc + local_28,
                     (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore + local_28);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          std::pair<int,_long>::operator=(in_RDI->fExtAlloc + local_28,in_RDX);
        }
        if (((in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore != in_RDI->fExtAlloc) &&
           (ppVar5 = (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore,
           ppVar5 != (pair<int,_long> *)0x0)) {
          operator_delete__(ppVar5);
        }
        (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore = in_RDI->fExtAlloc;
        (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0x3c;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar3;
        uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
        if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        ppVar5 = (pair<int,_long> *)operator_new__(uVar4);
        if (uVar3 != 0) {
          local_80 = ppVar5;
          do {
            std::pair<int,_long>::pair<int,_long,_true>(local_80);
            local_80 = local_80 + 1;
          } while (local_80 != ppVar5 + uVar3);
        }
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements;
            local_30 = local_30 + 1) {
          std::pair<int,_long>::operator=
                    (ppVar5 + local_30,
                     (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore + local_30);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          std::pair<int,_long>::operator=(ppVar5 + local_30,in_RDX);
        }
        if (((in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore != in_RDI->fExtAlloc) &&
           (ppVar1 = (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore,
           ppVar1 != (pair<int,_long> *)0x0)) {
          operator_delete__(ppVar1);
        }
        (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar5;
        (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc = uVar3;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements; local_20 < in_RSI;
          local_20 = local_20 + 1) {
        std::pair<int,_long>::operator=
                  ((in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore + local_20,in_RDX);
      }
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}